

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthCountOnesInCofsSlow(uint *pTruth,int nVars,int *pStore,uint *pAux)

{
  int iVar1;
  int local_2c;
  int i;
  uint *pAux_local;
  int *pStore_local;
  int nVars_local;
  uint *pTruth_local;
  
  for (local_2c = 0; local_2c < nVars; local_2c = local_2c + 1) {
    Kit_TruthCofactor0New(pAux,pTruth,nVars,local_2c);
    iVar1 = Kit_TruthCountOnes(pAux,nVars);
    pStore[local_2c << 1] = iVar1 / 2;
    Kit_TruthCofactor1New(pAux,pTruth,nVars,local_2c);
    iVar1 = Kit_TruthCountOnes(pAux,nVars);
    pStore[local_2c * 2 + 1] = iVar1 / 2;
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofsSlow( unsigned * pTruth, int nVars, int * pStore, unsigned * pAux )
{
    int i;
    for ( i = 0; i < nVars; i++ )
    {
        Kit_TruthCofactor0New( pAux, pTruth, nVars, i );
        pStore[2*i+0] = Kit_TruthCountOnes( pAux, nVars ) / 2;
        Kit_TruthCofactor1New( pAux, pTruth, nVars, i );
        pStore[2*i+1] = Kit_TruthCountOnes( pAux, nVars ) / 2;
    }
}